

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O2

void __thiscall
QuickConnection::OnMessage
          (QuickConnection *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  uint16_t packet_number;
  uint32_t session_id;
  TaskQueueBase *pTVar1;
  ProcessThread *pPVar2;
  AckThread *this_00;
  bool bVar3;
  int iVar4;
  TaskQueueBase *pTVar5;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char>,_true,_true> _Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ReceivedPacket *pRVar7;
  ushort sequence_number;
  uint16_t data_len_00;
  unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_> packet;
  undefined1 local_70 [8];
  char *local_68;
  int local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  int16_t local_38;
  
  pTVar1 = &this->_thread->super_TaskQueueBase;
  pTVar5 = dd::TaskQueueBase::Current();
  if (pTVar5 == pTVar1) {
    data_len_00 = data_len - 0x11;
    packet._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char>,_true,_true>)data;
    if ((short)data_len_00 < 1) {
      local_70 = (undefined1  [8])0x12c891;
      local_68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
      ;
      local_60 = 0x51;
      LogWrapper::Write(&g_quic_log,(Location *)local_70,2,
                        "process payload failed, payload_len = %d",
                        (ulong)(uint)(int)(short)data_len_00);
    }
    else {
      iVar4 = (*((this->_clock)._M_t.
                 super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
                 super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
                 super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])
                        ();
      this->_latest_recv_msg_time = CONCAT44(extraout_var,iVar4);
      if (this->_latest_received_timestamp <= *(ulong *)(data + 9)) {
        this->_latest_received_timestamp = *(ulong *)(data + 9);
        this_00 = this->_ack_thread;
        session_id = this->_session_id;
        packet_number = *(uint16_t *)(data + 5);
        iVar4 = (*((this->_clock)._M_t.
                   super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
                   super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3]
                )();
        AckThread::Append(this_00,session_id,packet_number,CONCAT44(extraout_var_00,iVar4));
        bVar3 = quic::IsNewer<unsigned_short>
                          (*(unsigned_short *)(data + 7),this->_expect_recv_sequence_number);
        sequence_number = *(ushort *)(data + 7);
        if ((bVar3) || (sequence_number == this->_expect_recv_sequence_number)) {
          pRVar7 = this->_received_packets[sequence_number]._M_t.
                   super___uniq_ptr_impl<ReceivedPacket,_std::default_delete<ReceivedPacket>_>._M_t.
                   super__Tuple_impl<0UL,_ReceivedPacket_*,_std::default_delete<ReceivedPacket>_>.
                   super__Head_base<0UL,_ReceivedPacket_*,_false>._M_head_impl;
          if ((pRVar7 != (ReceivedPacket *)0x0) &&
             ((uint)pRVar7->data_len != (int)(short)data_len_00)) {
            __assert_fail("_received_packets[msg->sequence_number].get()->data_len == payload_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
                          ,0x72,
                          "void QuickConnection::OnMessage(const std::string &, uint16_t, const uint8_t *, int16_t)"
                         );
          }
          pRVar7 = (ReceivedPacket *)operator_new(0x10);
          ReceivedPacket::ReceivedPacket(pRVar7,sequence_number,data + 0x11,data_len_00);
          std::__uniq_ptr_impl<ReceivedPacket,_std::default_delete<ReceivedPacket>_>::reset
                    ((__uniq_ptr_impl<ReceivedPacket,_std::default_delete<ReceivedPacket>_> *)
                     (this->_received_packets + sequence_number),pRVar7);
          sequence_number = *(ushort *)(data + 7);
        }
        DeliverReceivedPackets(this,sequence_number);
      }
    }
    std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::~unique_ptr(&packet);
  }
  else {
    local_70 = (undefined1  [8])this;
    std::__cxx11::string::string((string *)&local_68,(string *)ip);
    local_48 = CONCAT22(local_48._2_2_,port);
    pPVar2 = this->_thread;
    uStack_40 = data;
    local_38 = data_len;
    _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>)operator_new(0x48);
    *(undefined ***)
     _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = &PTR__ClosureTask_00137770;
    *(undefined1 (*) [8])
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8) = local_70;
    std::__cxx11::string::string
              ((string *)
               ((long)_Var6.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
                      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x10),
               (string *)&local_68);
    *(int16_t *)
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x40) = local_38;
    *(undefined4 *)
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x30) = local_48;
    *(undefined4 *)
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x34) = uStack_44;
    *(undefined4 *)
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x38) =
         (undefined4)uStack_40;
    *(undefined4 *)
     ((long)_Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x3c) = uStack_40._4_4_;
    packet._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char>,_true,_true>)
         _Var6.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (*(pPVar2->super_TaskQueueBase)._vptr_TaskQueueBase[1])(pPVar2);
    if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>)
        packet._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>)0x0) {
      (**(code **)(*(long *)packet._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void QuickConnection::OnMessage(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	if (!_thread->IsCurrent()) {
		PostTask([this, ip, port, data, data_len] {
			OnMessage(ip, port, data, data_len);
		});
		return;
	}
	std::unique_ptr<uint8_t> packet(const_cast<uint8_t*>(data));

	QuickPayload *msg = (QuickPayload*)data;
	int16_t payload_len = data_len - sizeof(QuickPayload) + 1;
	if (payload_len <= 0) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "process payload failed, payload_len = %d", payload_len);
		return;
	}

	_latest_recv_msg_time = _clock->Now().ToDebuggingValue();

	// udp�������������£������� send_timestamp��_latest_received_timestampС�����������������İ�ֱ�ӽ��ж�������ack����Ҫ�ظ���
	// ���Ͷ��ڷ���ʱ��send_timestamp���ϸ񵥵������ģ������İ��ɷ��Ͱ������ش����ɡ�
	// һ�������£�ֻ������·�ɷ����仯�������£�udp���ſ��ܻ������������������������������������������շ�����ʱ��
	// ���������������޵�����Ҳ���п��ܳ���������
	if (msg->send_timestamp < _latest_received_timestamp)
		return;
	_latest_received_timestamp = msg->send_timestamp;

#ifdef OUTPUT_VERBOSE_INFO
	dd::OutputDebugInfo("recv packet, packet number = %u, sequence number = %u, len = %d, now = %llu\r\n", msg->packet_number, msg->sequence_number,
			payload_len, _clock->Now().ToDebuggingValue());
#endif

	uint64_t timestamp = 0;
	memcpy(&timestamp, msg->payload, sizeof(&time));
	PacketInfo info(msg->sequence_number, payload_len, timestamp, _expect_recv_sequence_number, msg->packet_number);
	//_real_recv_packets_len[timestamp] = info;
#ifdef OUTPUT_DEBUG_INFO
		_real_recv_packets_len.push_back(info);
#endif

	_ack_thread->Append(_session_id, msg->packet_number, _clock->Now().ToDebuggingValue());

	// ֻ�бȵ�ǰ�������յ����Ÿ��µİ��ŷ��뵽���塣
	// �ش��������£�sequence_number���ܻ��� _expect_recv_sequence_number����
	if (quic::IsNewer(msg->sequence_number, _expect_recv_sequence_number) || msg->sequence_number == _expect_recv_sequence_number) {
		if(_received_packets[msg->sequence_number].get())
			assert(_received_packets[msg->sequence_number].get()->data_len == payload_len);
		_received_packets[msg->sequence_number].reset(new ReceivedPacket(msg->sequence_number, msg->payload, payload_len));

	}

	DeliverReceivedPackets(msg->sequence_number);
}